

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumCheckerboardTexture *
pbrt::SpectrumCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SpectrumType SVar2;
  int iVar3;
  int iVar4;
  uintptr_t iptr;
  SpectrumCheckerboardTexture *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar6;
  undefined4 extraout_var_03;
  Allocator alloc_00;
  Allocator alloc_01;
  int dim;
  SpectrumTextureHandle tex2;
  SpectrumTextureHandle tex1;
  string ret;
  int local_e8;
  SpectrumType local_e4;
  Transform *local_e0;
  undefined1 local_d8 [16];
  string local_c8;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  FileLoc *local_48;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_02;
  
  paVar1 = &local_c8.field_2;
  local_e4 = spectrumType;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"dimension","");
  local_e8 = TextureParameterDictionary::GetOneInt(parameters,&local_c8,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 - 4U < 0xfffffffe) {
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity =
         local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<int&>
              (&local_c8,"%d dimensional checkerboard texture not supported",&local_e8);
    Error(loc,local_c8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pSVar5 = (SpectrumCheckerboardTexture *)0x0;
  }
  else {
    local_e0 = renderFromTexture;
    local_48 = loc;
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar3) = 0;
    iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var_00,iVar4) = 0x3f800000;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"tex1","");
    SVar2 = local_e4;
    local_38 = CONCAT44(extraout_var_00,iVar4) | 0x1000000000000;
    alloc_00.memoryResource._4_4_ = 0;
    alloc_00.memoryResource._0_4_ = local_e4;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)(local_d8 + 8),(string *)parameters,
               (SpectrumHandle *)&local_c8,(SpectrumType)&local_38,alloc_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"tex2","");
    local_40 = CONCAT44(extraout_var,iVar3) | 0x1000000000000;
    alloc_01.memoryResource._4_4_ = 0;
    alloc_01.memoryResource._0_4_ = SVar2;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)local_d8,(string *)parameters,
               (SpectrumHandle *)&local_c8,(SpectrumType)&local_40,alloc_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 == 2) {
      TextureMapping2DHandle::Create
                ((TextureMapping2DHandle *)&local_c8,parameters->dict,local_e0,local_48,alloc);
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pSVar5 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_01,iVar3);
      (pSVar5->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = (uintptr_t)local_c8._M_dataplus._M_p;
      (pSVar5->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits = 0;
      pSVar5->tex[0].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_d8._8_8_;
      pSVar5->tex[1].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_d8._0_8_;
    }
    else {
      local_c8._M_dataplus._M_p = *(pointer *)(local_e0->mInv).m[0];
      local_c8._M_string_length = *(size_type *)((local_e0->mInv).m[0] + 2);
      local_c8.field_2._M_allocated_capacity = *(undefined8 *)(local_e0->mInv).m[1];
      local_c8.field_2._8_8_ = *(undefined8 *)((local_e0->mInv).m[1] + 2);
      uStack_a8 = *(undefined8 *)(local_e0->mInv).m[2];
      uStack_a0 = *(undefined8 *)((local_e0->mInv).m[2] + 2);
      uStack_98 = *(undefined8 *)(local_e0->mInv).m[3];
      uStack_90 = *(undefined8 *)((local_e0->mInv).m[3] + 2);
      local_88 = *(undefined8 *)(local_e0->m).m[0];
      uStack_80 = *(undefined8 *)((local_e0->m).m[0] + 2);
      uStack_78 = *(undefined8 *)(local_e0->m).m[1];
      uStack_70 = *(undefined8 *)((local_e0->m).m[1] + 2);
      uStack_68 = *(undefined8 *)(local_e0->m).m[2];
      uStack_60 = *(undefined8 *)((local_e0->m).m[2] + 2);
      uStack_58 = *(undefined8 *)(local_e0->m).m[3];
      uStack_50 = *(undefined8 *)((local_e0->m).m[3] + 2);
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
      puVar6 = (undefined8 *)CONCAT44(extraout_var_02,iVar3);
      *puVar6 = local_c8._M_dataplus._M_p;
      puVar6[1] = local_c8._M_string_length;
      puVar6[2] = local_c8.field_2._M_allocated_capacity;
      puVar6[3] = local_c8.field_2._8_8_;
      puVar6[4] = uStack_a8;
      puVar6[5] = uStack_a0;
      puVar6[6] = uStack_98;
      puVar6[7] = uStack_90;
      puVar6[8] = local_88;
      puVar6[9] = uStack_80;
      puVar6[10] = uStack_78;
      puVar6[0xb] = uStack_70;
      puVar6[0xc] = uStack_68;
      puVar6[0xd] = uStack_60;
      puVar6[0xe] = uStack_58;
      puVar6[0xf] = uStack_50;
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pSVar5 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_03,iVar3);
      (pSVar5->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = 0;
      (pSVar5->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
           (ulong)puVar6 | 0x1000000000000;
      pSVar5->tex[0].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_d8._8_8_;
      pSVar5->tex[1].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = local_d8._0_8_;
    }
  }
  return pSVar5;
}

Assistant:

SpectrumCheckerboardTexture *SpectrumCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }

    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    SpectrumTextureHandle tex1 =
        parameters.GetSpectrumTexture("tex1", one, spectrumType, alloc);
    SpectrumTextureHandle tex2 =
        parameters.GetSpectrumTexture("tex2", zero, spectrumType, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2DHandle map =
            TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

        return alloc.new_object<SpectrumCheckerboardTexture>(map, nullptr, tex1, tex2);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3DHandle map =
            TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<SpectrumCheckerboardTexture>(nullptr, map, tex1, tex2);
    }
}